

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testBaseLimits(string *tempdir)

{
  ostream *poVar1;
  char *in_RCX;
  int mxh;
  int mxw;
  
  exr_set_default_maximum_image_size(0x2a,0x2a);
  exr_get_default_maximum_image_size(&mxw,&mxh);
  if ((mxw == 0x2a) && (mxh == 0x2a)) {
    exr_set_default_maximum_image_size(0xffffffffffffffff,0xffffffff);
    exr_get_default_maximum_image_size(&mxw,&mxh);
    if ((mxw != 0x2a) || (mxh != 0x2a)) goto LAB_001092a5;
    exr_set_default_maximum_image_size(0x54,0xffffffffffffffff);
    exr_get_default_maximum_image_size(&mxw,&mxh);
    if ((mxw != 0x2a) || (mxh != 0x2a)) goto LAB_001092ff;
    exr_set_default_maximum_image_size(0xffffffffffffffff,0x54);
    exr_get_default_maximum_image_size(&mxw,&mxh);
    if ((mxw != 0x2a) || (mxh != 0x2a)) goto LAB_00109359;
    exr_set_default_maximum_tile_size(0x80,0x80);
    exr_get_default_maximum_tile_size(&mxw,&mxh);
    if ((mxw != 0x80) || (mxh != 0x80)) goto LAB_001093b3;
    exr_set_default_maximum_tile_size(0xffffffffffffffff,0xffffffff);
    exr_get_default_maximum_tile_size(&mxw,&mxh);
    if ((mxw != 0x80) || (mxh != 0x80)) goto LAB_0010940d;
    exr_set_default_maximum_tile_size(0x54,0xffffffffffffffff);
    exr_get_default_maximum_tile_size(&mxw,&mxh);
    if ((mxw == 0x80) && (mxh == 0x80)) {
      exr_set_default_maximum_tile_size(0xffffffffffffffff,0x54);
      exr_get_default_maximum_tile_size(&mxw,&mxh);
      if ((mxw == 0x80) && (mxh == 0x80)) {
        exr_set_default_maximum_image_size(0,0);
        exr_set_default_maximum_tile_size(0,0);
        return;
      }
      goto LAB_001094c1;
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_image_size: 42, 42 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0xe5,0x14e200,in_RCX);
LAB_001092a5:
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0xee,0x14e200,in_RCX);
LAB_001092ff:
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0xf8,0x14e200,in_RCX);
LAB_00109359:
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x102,0x14e200,in_RCX);
LAB_001093b3:
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_tile_size: 128, 128 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x10b,0x14e200,in_RCX);
LAB_0010940d:
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x114,0x14e200,in_RCX);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
  std::endl<char,std::char_traits<char>>(poVar1);
  core_test_fail("false",(char *)0x11d,0x14e200,in_RCX);
LAB_001094c1:
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
  std::endl<char,std::char_traits<char>>(poVar1);
  core_test_fail("false",(char *)0x126,0x14e200,in_RCX);
  exr_print_context_info(0,0);
  exr_print_context_info(0,0);
  exr_print_context_info(0,1);
  return;
}

Assistant:

void
testBaseLimits (const std::string& tempdir)
{
    int mxw, mxh;
    exr_set_default_maximum_image_size (42, 42);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr << "Unable to set_default_maximum_image_size: 42, 42 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (-1, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (84, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (-1, 84);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_tile_size (128, 128);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr << "Unable to set_default_maximum_tile_size: 128, 128 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (84, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, 84);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (0, 0);
    exr_set_default_maximum_tile_size (0, 0);
}